

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  undefined4 *puVar1;
  LargeHeapBlock *pLVar2;
  code *pcVar3;
  bool bVar4;
  LargeHeapBlock **ppLVar5;
  undefined8 *in_FS_OFFSET;
  
  if (heapBlock->hasPartialFreeObjects == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b3,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar4) goto LAB_0024e758;
    *puVar1 = 0;
  }
  if (heapBlock->isInPendingDisposeList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b4,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar4) {
LAB_0024e758:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  pLVar2 = this->largeBlockList;
  if ((pLVar2 == (LargeHeapBlock *)0x0) ||
     ((ulong)((long)heapBlock->addressEnd - (long)heapBlock->allocAddressEnd) <=
      (ulong)((long)pLVar2->addressEnd - (long)pLVar2->allocAddressEnd))) {
    ppLVar5 = &this->fullLargeBlockList;
    heapBlock->next = this->fullLargeBlockList;
  }
  else {
    heapBlock->next = pLVar2->next;
    pLVar2->next = this->fullLargeBlockList;
    this->fullLargeBlockList = pLVar2;
    ppLVar5 = &this->largeBlockList;
  }
  *ppLVar5 = heapBlock;
  return;
}

Assistant:

void
LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    if (this->largeBlockList != nullptr && heapBlock->GetFreeSize() > this->largeBlockList->GetFreeSize())
    {
        heapBlock->SetNextBlock(this->largeBlockList->GetNextBlock());
        this->largeBlockList->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = this->largeBlockList;
        this->largeBlockList = heapBlock;
    }
    else
    {
        heapBlock->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = heapBlock;
    }
}